

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall
Json::Reader::parse(Reader *this,char *beginDoc,char *endDoc,Value *root,bool collectComments)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  ulong uVar4;
  Value *in_RCX;
  Location in_RDX;
  undefined8 in_RSI;
  string *in_RDI;
  byte in_R8B;
  Token token;
  bool successful;
  Reader *in_stack_000000f8;
  Token *in_stack_ffffffffffffff58;
  Reader *in_stack_ffffffffffffff60;
  CommentPlacement placement;
  allocator *paVar5;
  Value *in_stack_ffffffffffffff70;
  deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>
  *in_stack_ffffffffffffff80;
  string local_78 [32];
  undefined4 local_58;
  undefined7 in_stack_ffffffffffffffc0;
  Value *message;
  undefined7 in_stack_ffffffffffffffd0;
  bool local_1;
  
  bVar1 = in_R8B & 1;
  if ((in_RDI[8]._M_string_length & 1) == 0) {
    bVar1 = 0;
  }
  *(undefined8 *)(in_RDI + 6) = in_RSI;
  in_RDI[6]._M_string_length = (size_type)in_RDX;
  *(byte *)((long)&in_RDI[8]._M_string_length + 4) = bVar1;
  in_RDI[6].field_2._M_allocated_capacity = *(size_type *)(in_RDI + 6);
  *(undefined8 *)((long)&in_RDI[6].field_2 + 8) = 0;
  *(undefined8 *)(in_RDI + 7) = 0;
  std::__cxx11::string::clear();
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::clear
            (in_stack_ffffffffffffff80);
  while (bVar2 = std::
                 stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::
                 empty((stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>
                        *)0x2c1622), ((bVar2 ^ 0xffU) & 1) != 0) {
    std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::pop
              ((stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_> *)
               0x2c1634);
  }
  message = in_RCX;
  std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::push
            (&in_stack_ffffffffffffff60->nodes_,(value_type *)in_stack_ffffffffffffff58);
  bVar3 = readValue(in_stack_000000f8);
  skipCommentTokens(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  placement = (CommentPlacement)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  if (((in_RDI[8]._M_string_length & 0x100000000) != 0) &&
     (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
    Value::setComment(in_stack_ffffffffffffff70,in_RDI,placement);
  }
  if ((((in_RDI[8]._M_string_length & 0x100) == 0) || (bVar2 = Value::isArray(in_RCX), bVar2)) ||
     (bVar2 = Value::isObject(in_RCX), bVar2)) {
    local_1 = (bool)(bVar3 & 1);
  }
  else {
    local_58 = 0xd;
    paVar5 = (allocator *)&stack0xffffffffffffff87;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_78,"A valid JSON document must be either an array or an object value.",paVar5);
    addError((Reader *)CONCAT17(bVar1,in_stack_ffffffffffffffd0),(string *)message,
             (Token *)CONCAT17(bVar3,in_stack_ffffffffffffffc0),in_RDX);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Reader::parse(const char* beginDoc,
                   const char* endDoc,
                   Value& root,
                   bool collectComments) {
  if (!features_.allowComments_) {
    collectComments = false;
  }

  begin_ = beginDoc;
  end_ = endDoc;
  collectComments_ = collectComments;
  current_ = begin_;
  lastValueEnd_ = 0;
  lastValue_ = 0;
  commentsBefore_.clear();
  errors_.clear();
  while (!nodes_.empty())
    nodes_.pop();
  nodes_.push(&root);

  bool successful = readValue();
  Token token;
  skipCommentTokens(token);
  if (collectComments_ && !commentsBefore_.empty())
    root.setComment(commentsBefore_, commentAfter);
  if (features_.strictRoot_) {
    if (!root.isArray() && !root.isObject()) {
      // Set error location to start of doc, ideally should be first token found
      // in doc
      token.type_ = tokenError;
      token.start_ = beginDoc;
      token.end_ = endDoc;
      addError(
          "A valid JSON document must be either an array or an object value.",
          token);
      return false;
    }
  }
  return successful;
}